

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionCornerCaseHelper2<long,_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase2
               (longlong lhs,
               SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  if (rhs.m_int != -1 || lhs != -0x8000000000000000) {
    return false;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }